

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_panner_init(ma_panner_config *pConfig,ma_panner *pPanner)

{
  ma_panner *pPanner_local;
  ma_panner_config *pConfig_local;
  
  if (pPanner == (ma_panner *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pPanner,0,0x10);
    if (pConfig == (ma_panner_config *)0x0) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      pPanner->format = pConfig->format;
      pPanner->channels = pConfig->channels;
      pPanner->mode = pConfig->mode;
      pPanner->pan = pConfig->pan;
      pConfig_local._4_4_ = MA_SUCCESS;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_panner_init(const ma_panner_config* pConfig, ma_panner* pPanner)
{
    if (pPanner == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pPanner);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    pPanner->format   = pConfig->format;
    pPanner->channels = pConfig->channels;
    pPanner->mode     = pConfig->mode;
    pPanner->pan      = pConfig->pan;

    return MA_SUCCESS;
}